

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::ColumnChunk::ColumnChunk(ColumnChunk *this)

{
  *(undefined ***)this = &PTR__ColumnChunk_017bbb40;
  (this->file_path)._M_dataplus._M_p = (pointer)&(this->file_path).field_2;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  this->file_offset = 0;
  ColumnMetaData::ColumnMetaData(&this->meta_data);
  this->offset_index_offset = 0;
  this->offset_index_length = 0;
  this->column_index_offset = 0;
  this->column_index_length = 0;
  ColumnCryptoMetaData::ColumnCryptoMetaData(&this->crypto_metadata);
  (this->encrypted_column_metadata)._M_dataplus._M_p =
       (pointer)&(this->encrypted_column_metadata).field_2;
  (this->encrypted_column_metadata)._M_string_length = 0;
  (this->encrypted_column_metadata).field_2._M_local_buf[0] = '\0';
  this->__isset = (_ColumnChunk__isset)0x0;
  return;
}

Assistant:

ColumnChunk::ColumnChunk() noexcept
   : file_path(),
     file_offset(0LL),
     offset_index_offset(0),
     offset_index_length(0),
     column_index_offset(0),
     column_index_length(0),
     encrypted_column_metadata() {
}